

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaAttrUsesDump(xmlSchemaItemListPtr uses,FILE *output)

{
  xmlSchemaAttributeUsePtr_conflict __stream;
  xmlChar *pxVar1;
  int local_4c;
  xmlChar *pxStack_48;
  int i;
  xmlChar *str;
  xmlChar *tns;
  xmlChar *name;
  xmlSchemaQNameRefPtr ref;
  xmlSchemaAttributeUseProhibPtr prohib;
  xmlSchemaAttributeUsePtr_conflict use;
  FILE *output_local;
  xmlSchemaItemListPtr uses_local;
  
  pxStack_48 = (xmlChar *)0x0;
  if ((uses != (xmlSchemaItemListPtr)0x0) && (uses->nbItems != 0)) {
    use = (xmlSchemaAttributeUsePtr_conflict)output;
    output_local = (FILE *)uses;
    fprintf((FILE *)output,"  attributes:\n");
    for (local_4c = 0; local_4c < *(int *)&output_local->_IO_read_ptr; local_4c = local_4c + 1) {
      prohib = *(xmlSchemaAttributeUseProhibPtr *)(*(long *)output_local + (long)local_4c * 8);
      if (prohib->type == XML_SCHEMA_EXTRA_ATTR_USE_PROHIB) {
        fprintf((FILE *)use,"  [prohibition] ");
        ref = (xmlSchemaQNameRefPtr)prohib;
        tns = prohib->name;
        str = prohib->targetNamespace;
      }
      else if (prohib->type == XML_SCHEMA_EXTRA_QNAMEREF) {
        fprintf((FILE *)use,"  [reference] ");
        name = (xmlChar *)prohib;
        tns = prohib->targetNamespace;
        str = *(xmlChar **)&prohib->isRef;
      }
      else {
        fprintf((FILE *)use,"  [use] ");
        tns = *(xmlChar **)(prohib->targetNamespace + 0x10);
        str = *(xmlChar **)(prohib->targetNamespace + 0x70);
      }
      __stream = use;
      pxVar1 = xmlSchemaFormatQName(&stack0xffffffffffffffb8,str,tns);
      fprintf((FILE *)__stream,"\'%s\'\n",pxVar1);
      if (pxStack_48 != (xmlChar *)0x0) {
        (*xmlFree)(pxStack_48);
        pxStack_48 = (xmlChar *)0x0;
      }
    }
  }
  return;
}

Assistant:

static void
xmlSchemaAttrUsesDump(xmlSchemaItemListPtr uses, FILE * output)
{
    xmlSchemaAttributeUsePtr use;
    xmlSchemaAttributeUseProhibPtr prohib;
    xmlSchemaQNameRefPtr ref;
    const xmlChar *name, *tns;
    xmlChar *str = NULL;
    int i;

    if ((uses == NULL) || (uses->nbItems == 0))
        return;

    fprintf(output, "  attributes:\n");
    for (i = 0; i < uses->nbItems; i++) {
	use = uses->items[i];
	if (use->type == XML_SCHEMA_EXTRA_ATTR_USE_PROHIB) {
	    fprintf(output, "  [prohibition] ");
	    prohib = (xmlSchemaAttributeUseProhibPtr) use;
	    name = prohib->name;
	    tns = prohib->targetNamespace;
	} else if (use->type == XML_SCHEMA_EXTRA_QNAMEREF) {
	    fprintf(output, "  [reference] ");
	    ref = (xmlSchemaQNameRefPtr) use;
	    name = ref->name;
	    tns = ref->targetNamespace;
	} else {
	    fprintf(output, "  [use] ");
	    name = WXS_ATTRUSE_DECL_NAME(use);
	    tns = WXS_ATTRUSE_DECL_TNS(use);
	}
	fprintf(output, "'%s'\n",
	    (const char *) xmlSchemaFormatQName(&str, tns, name));
	FREE_AND_NULL(str);
    }
}